

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,unsigned_int,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (hugeint_t *ldata,uint *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  ulong uVar6;
  int64_t *piVar7;
  ValidityMask *pVVar8;
  ValidityMask *pVVar9;
  void *pvVar10;
  unsigned_long uVar11;
  ValidityMask *pVVar12;
  ulong uVar13;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  int64_t *local_88;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_88 = &ldata->upper;
      pVVar8 = (ValidityMask *)0x0;
      pvVar10 = dataptr;
      do {
        input.upper = (int64_t)result_mask;
        input.lower = *local_88;
        uVar4 = VectorTryCastOperator<duckdb::NumericTryCast>::
                Operation<duckdb::hugeint_t,unsigned_int>
                          ((VectorTryCastOperator<duckdb::NumericTryCast> *)
                           ((hugeint_t *)(local_88 + -1))->lower,input,pVVar8,(idx_t)dataptr,pvVar10
                          );
        result_data[(long)pVVar8] = uVar4;
        pVVar8 = (ValidityMask *)
                 ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        local_88 = local_88 + 2;
      } while ((ValidityMask *)count != pVVar8);
    }
  }
  else {
    pvVar10 = dataptr;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      pVVar8 = (ValidityMask *)0x0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = puVar1[uVar6];
        }
        pVVar9 = pVVar8 + 2;
        if (count <= pVVar8 + 2) {
          pVVar9 = (ValidityMask *)count;
        }
        pVVar12 = pVVar9;
        if (uVar11 != 0) {
          pVVar12 = pVVar8;
          if (uVar11 == 0xffffffffffffffff) {
            if (pVVar8 < pVVar9) {
              piVar7 = &ldata[(long)pVVar8].upper;
              do {
                input_00.upper = (int64_t)result_mask;
                input_00.lower = *piVar7;
                uVar4 = VectorTryCastOperator<duckdb::NumericTryCast>::
                        Operation<duckdb::hugeint_t,unsigned_int>
                                  ((VectorTryCastOperator<duckdb::NumericTryCast> *)
                                   ((hugeint_t *)(piVar7 + -1))->lower,input_00,pVVar12,
                                   (idx_t)dataptr,pvVar10);
                result_data[(long)pVVar12] = uVar4;
                pVVar12 = (ValidityMask *)
                          ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1);
                piVar7 = piVar7 + 2;
              } while (pVVar9 != pVVar12);
            }
          }
          else if (pVVar8 < pVVar9) {
            piVar7 = &ldata[(long)pVVar8].upper;
            uVar13 = 0;
            do {
              if ((uVar11 >> (uVar13 & 0x3f) & 1) != 0) {
                input_01.upper = (int64_t)result_mask;
                input_01.lower = *piVar7;
                uVar4 = VectorTryCastOperator<duckdb::NumericTryCast>::
                        Operation<duckdb::hugeint_t,unsigned_int>
                                  ((VectorTryCastOperator<duckdb::NumericTryCast> *)
                                   ((hugeint_t *)(piVar7 + -1))->lower,input_01,
                                   (ValidityMask *)
                                   ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).
                                           validity_mask + uVar13),(idx_t)dataptr,pvVar10);
                result_data
                [(long)((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       uVar13)] = uVar4;
              }
              uVar13 = uVar13 + 1;
              piVar7 = piVar7 + 2;
            } while ((undefined1 *)((long)pVVar8 + (uVar13 - (long)pVVar9)) != (undefined1 *)0x0);
            pVVar12 = (ValidityMask *)
                      ((long)&(pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                      uVar13);
          }
        }
        uVar6 = uVar6 + 1;
        pVVar8 = pVVar12;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}